

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall
correctness_div_rounding_negative_Test::~correctness_div_rounding_negative_Test
          (correctness_div_rounding_negative_Test *this)

{
  void *in_RDI;
  
  ~correctness_div_rounding_negative_Test((correctness_div_rounding_negative_Test *)0x127798);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(correctness, div_rounding_negative)
{
    big_integer a = 23;
    big_integer b = -5;
    big_integer c = -23;
    big_integer d = 5;

    EXPECT_TRUE(a / b == -4);
    EXPECT_TRUE(c / d == -4);
    EXPECT_TRUE(a % b == 3);
    EXPECT_TRUE(c % d == -3);
}